

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_casts.cpp
# Opt level: O1

BoundCastInfo *
duckdb::DefaultCasts::UnionCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  idx_t iVar3;
  string *psVar4;
  ulong index;
  child_list_t<LogicalType> varchar_members;
  LogicalType varchar_type;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_f0;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_e8;
  long *local_e0;
  BoundCastInfo *local_d8;
  BindCastInput *local_d0;
  pointer local_c8;
  pointer ppStack_c0;
  pointer local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId>
  local_70;
  child_list_t<LogicalType> local_48;
  
  local_d8 = __return_storage_ptr__;
  local_d0 = input;
  if (target->id_ == UNION) {
    BindUnionToUnionCast((duckdb *)&local_e0,input,source,target);
    __return_storage_ptr__ = local_d8;
    BoundCastInfo::BoundCastInfo
              (local_d8,UnionToUnionCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_e0,InitUnionToUnionLocalState);
    if (local_e0 != (long *)0x0) {
      (**(code **)(*local_e0 + 8))();
    }
  }
  else if (target->id_ == VARCHAR) {
    local_c8 = (pointer)0x0;
    ppStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    paVar1 = &local_70.first.field_2;
    for (index = 0; iVar3 = UnionType::GetMemberCount(source), index < iVar3; index = index + 1) {
      psVar4 = UnionType::GetMemberName_abi_cxx11_(source,index);
      pcVar2 = (psVar4->_M_dataplus)._M_p;
      local_70.first._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + psVar4->_M_string_length);
      local_70.second = VARCHAR;
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalTypeId,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&local_a8,&local_70);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&local_c8,&local_a8);
      LogicalType::~LogicalType(&local_a8.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.first._M_dataplus._M_p != &local_a8.first.field_2) {
        operator_delete(local_a8.first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_70.first._M_dataplus._M_p);
      }
    }
    local_48.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_c8;
    local_48.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppStack_c0;
    local_48.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_b8;
    local_c8 = (pointer)0x0;
    ppStack_c0 = (pointer)0x0;
    local_b8 = (pointer)0x0;
    LogicalType::UNION((LogicalType *)&local_a8,&local_48);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_48);
    BindUnionToUnionCast((duckdb *)&local_f0,local_d0,source,(LogicalType *)&local_a8);
    __return_storage_ptr__ = local_d8;
    BoundCastInfo::BoundCastInfo
              (local_d8,UnionToVarcharCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_f0,InitUnionToUnionLocalState);
    if (local_f0._M_head_impl != (BoundCastData *)0x0) {
      (*(local_f0._M_head_impl)->_vptr_BoundCastData[1])();
    }
    local_f0._M_head_impl = (BoundCastData *)0x0;
    LogicalType::~LogicalType((LogicalType *)&local_a8);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_c8);
  }
  else {
    local_e8._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,TryVectorNullCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_e8,(init_cast_local_state_t)0x0);
    if (local_e8._M_head_impl != (BoundCastData *)0x0) {
      (*(local_e8._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::UnionCastSwitch(BindCastInput &input, const LogicalType &source,
                                            const LogicalType &target) {
	D_ASSERT(source.id() == LogicalTypeId::UNION);
	switch (target.id()) {
	case LogicalTypeId::VARCHAR: {
		// bind a cast in which we convert all members to VARCHAR first
		child_list_t<LogicalType> varchar_members;
		for (idx_t member_idx = 0; member_idx < UnionType::GetMemberCount(source); member_idx++) {
			varchar_members.push_back(make_pair(UnionType::GetMemberName(source, member_idx), LogicalType::VARCHAR));
		}
		auto varchar_type = LogicalType::UNION(std::move(varchar_members));
		return BoundCastInfo(UnionToVarcharCast, BindUnionToUnionCast(input, source, varchar_type),
		                     InitUnionToUnionLocalState);
	}
	case LogicalTypeId::UNION:
		return BoundCastInfo(UnionToUnionCast, BindUnionToUnionCast(input, source, target), InitUnionToUnionLocalState);
	default:
		return TryVectorNullCast;
	}
}